

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void sqlite3AddPrimaryKey(Parse *pParse,ExprList *pList,int onError,int autoInc,int sortOrder)

{
  u16 *puVar1;
  short sVar2;
  int iVar3;
  Table *pTVar4;
  Index *pIVar5;
  byte bVar6;
  byte *pbVar7;
  bool bVar8;
  byte bVar9;
  uint uVar10;
  ulong uVar11;
  char *pcVar12;
  uchar *b;
  byte *pbVar13;
  ulong uVar14;
  byte *pbVar15;
  long lVar16;
  
  pTVar4 = pParse->pNewTable;
  if ((pTVar4 != (Table *)0x0) && (pParse->declareVtab == '\0')) {
    if ((pTVar4->tabFlags & 4) == 0) {
      bVar6 = pTVar4->tabFlags | 4;
      pTVar4->tabFlags = bVar6;
      if (pList == (ExprList *)0x0) {
        uVar10 = (int)pTVar4->nCol - 1;
        puVar1 = &pTVar4->aCol[(long)(int)pTVar4->nCol + -1].colFlags;
        *puVar1 = *puVar1 | 1;
      }
      else {
        iVar3 = pList->nExpr;
        uVar10 = 0xffffffff;
        if (0 < (long)iVar3) {
          sVar2 = pTVar4->nCol;
          uVar14 = (ulong)sVar2;
          lVar16 = 0;
          do {
            uVar10 = 0;
            if (0 < sVar2) {
              pbVar7 = (byte *)pList->a[lVar16].zName;
              uVar11 = 0;
              bVar8 = 0 < (long)uVar14;
              do {
                pbVar13 = (byte *)pTVar4->aCol[uVar11].zName;
                pbVar15 = pbVar7;
                bVar9 = *pbVar7;
                while ((bVar9 != 0 && (pbVar15 = pbVar15 + 1, ""[bVar9] == ""[*pbVar13]))) {
                  pbVar13 = pbVar13 + 1;
                  bVar9 = *pbVar15;
                }
                if (""[bVar9] == ""[*pbVar13]) {
                  if (bVar8) {
                    puVar1 = &pTVar4->aCol[uVar11 & 0xffffffff].colFlags;
                    *puVar1 = *puVar1 | 1;
                  }
                  goto LAB_0014c5ac;
                }
                uVar11 = uVar11 + 1;
                bVar8 = (long)uVar11 < (long)uVar14;
              } while (uVar11 != uVar14);
              uVar11 = uVar14 & 0xffffffff;
LAB_0014c5ac:
              uVar10 = (uint)uVar11;
            }
            lVar16 = lVar16 + 1;
          } while (lVar16 != iVar3);
        }
        if (1 < iVar3) {
          uVar10 = 0xffffffff;
        }
      }
      if (((int)uVar10 < 0) || ((int)pTVar4->nCol <= (int)uVar10)) {
        pbVar7 = (byte *)0x0;
      }
      else {
        pbVar7 = (byte *)pTVar4->aCol[uVar10].zType;
      }
      if (pbVar7 != (byte *)0x0) {
        bVar9 = *pbVar7;
        if (bVar9 == 0) {
          pcVar12 = "INTEGER";
        }
        else {
          pcVar12 = "INTEGER";
          do {
            pbVar7 = pbVar7 + 1;
            if (""[bVar9] != ""[(byte)*pcVar12]) break;
            pcVar12 = (char *)((byte *)pcVar12 + 1);
            bVar9 = *pbVar7;
          } while (bVar9 != 0);
        }
        if (""[bVar9] == ""[(byte)*pcVar12] && sortOrder == 0) {
          pTVar4->iPKey = (i16)uVar10;
          pTVar4->keyConf = (u8)onError;
          pTVar4->tabFlags = bVar6 | (char)autoInc << 3;
          goto LAB_0014c70c;
        }
      }
      if (autoInc == 0) {
        pIVar5 = sqlite3CreateIndex(pParse,(Token *)0x0,(Token *)0x0,(SrcList *)0x0,pList,onError,
                                    (Token *)0x0,(Token *)0x0,sortOrder,0);
        pList = (ExprList *)0x0;
        if (pIVar5 != (Index *)0x0) {
          pIVar5->field_0x4f = pIVar5->field_0x4f & 0xfc | 2;
          pList = (ExprList *)0x0;
        }
      }
      else {
        sqlite3ErrorMsg(pParse,"AUTOINCREMENT is only allowed on an INTEGER PRIMARY KEY");
      }
    }
    else {
      sqlite3ErrorMsg(pParse,"table \"%s\" has more than one primary key",pTVar4->zName);
    }
  }
LAB_0014c70c:
  sqlite3ExprListDelete(pParse->db,pList);
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3AddPrimaryKey(
  Parse *pParse,    /* Parsing context */
  ExprList *pList,  /* List of field names to be indexed */
  int onError,      /* What to do with a uniqueness conflict */
  int autoInc,      /* True if the AUTOINCREMENT keyword is present */
  int sortOrder     /* SQLITE_SO_ASC or SQLITE_SO_DESC */
){
  Table *pTab = pParse->pNewTable;
  char *zType = 0;
  int iCol = -1, i;
  if( pTab==0 || IN_DECLARE_VTAB ) goto primary_key_exit;
  if( pTab->tabFlags & TF_HasPrimaryKey ){
    sqlite3ErrorMsg(pParse, 
      "table \"%s\" has more than one primary key", pTab->zName);
    goto primary_key_exit;
  }
  pTab->tabFlags |= TF_HasPrimaryKey;
  if( pList==0 ){
    iCol = pTab->nCol - 1;
    pTab->aCol[iCol].colFlags |= COLFLAG_PRIMKEY;
  }else{
    for(i=0; i<pList->nExpr; i++){
      for(iCol=0; iCol<pTab->nCol; iCol++){
        if( sqlite3StrICmp(pList->a[i].zName, pTab->aCol[iCol].zName)==0 ){
          break;
        }
      }
      if( iCol<pTab->nCol ){
        pTab->aCol[iCol].colFlags |= COLFLAG_PRIMKEY;
      }
    }
    if( pList->nExpr>1 ) iCol = -1;
  }
  if( iCol>=0 && iCol<pTab->nCol ){
    zType = pTab->aCol[iCol].zType;
  }
  if( zType && sqlite3StrICmp(zType, "INTEGER")==0
        && sortOrder==SQLITE_SO_ASC ){
    pTab->iPKey = iCol;
    pTab->keyConf = (u8)onError;
    assert( autoInc==0 || autoInc==1 );
    pTab->tabFlags |= autoInc*TF_Autoincrement;
  }else if( autoInc ){
#ifndef SQLITE_OMIT_AUTOINCREMENT
    sqlite3ErrorMsg(pParse, "AUTOINCREMENT is only allowed on an "
       "INTEGER PRIMARY KEY");
#endif
  }else{
    Index *p;
    p = sqlite3CreateIndex(pParse, 0, 0, 0, pList, onError, 0, 0, sortOrder, 0);
    if( p ){
      p->autoIndex = 2;
    }
    pList = 0;
  }

primary_key_exit:
  sqlite3ExprListDelete(pParse->db, pList);
  return;
}